

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

void QMakeEvaluator::initStatics(void)

{
  char *str;
  Data *pDVar1;
  ProString *pPVar2;
  qsizetype qVar3;
  long lVar4;
  long in_FS_OFFSET;
  QLatin1String QVar5;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QLatin1String QVar9;
  QLatin1String QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  ProKey local_b8;
  QArrayDataPointer<ProString> local_88;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (QMakeInternal::statics._8_8_ == 0) {
    QVar5.m_data = " ";
    QVar5.m_size = 1;
    QString::operator=((QString *)QMakeInternal::statics,QVar5);
    QVar6.m_data = "true";
    QVar6.m_size = 4;
    QString::operator=((QString *)(QMakeInternal::statics + 0x18),QVar6);
    QVar7.m_data = "false";
    QVar7.m_size = 5;
    QString::operator=((QString *)(QMakeInternal::statics + 0x30),QVar7);
    ProKey::ProKey((ProKey *)&local_68,"CONFIG");
    QString::operator=((QString *)(QMakeInternal::statics + 0x48),(QString *)&local_68);
    QMakeInternal::statics._96_4_ = local_68.m_offset;
    QMakeInternal::statics._100_4_ = local_68.m_length;
    QMakeInternal::statics._104_8_ = local_68._32_8_;
    QMakeInternal::statics._112_8_ = local_68.m_hash;
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    ProKey::ProKey((ProKey *)&local_68,"ARGS");
    QString::operator=((QString *)(QMakeInternal::statics + 0x78),(QString *)&local_68);
    QMakeInternal::statics._144_4_ = local_68.m_offset;
    QMakeInternal::statics._148_4_ = local_68.m_length;
    QMakeInternal::statics._152_8_ = local_68._32_8_;
    QMakeInternal::statics._160_8_ = local_68.m_hash;
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    ProKey::ProKey((ProKey *)&local_68,"ARGC");
    QString::operator=((QString *)(QMakeInternal::statics + 0xa8),(QString *)&local_68);
    QMakeInternal::statics._192_4_ = local_68.m_offset;
    QMakeInternal::statics._196_4_ = local_68.m_length;
    QMakeInternal::statics._200_8_ = local_68._32_8_;
    QMakeInternal::statics._208_8_ = local_68.m_hash;
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QVar8.m_data = ".";
    QVar8.m_size = 1;
    QString::operator=((QString *)(QMakeInternal::statics + 0xd8),QVar8);
    QVar9.m_data = "..";
    QVar9.m_size = 2;
    QString::operator=((QString *)(QMakeInternal::statics + 0xf0),QVar9);
    QVar10.m_data = "ever";
    QVar10.m_size = 4;
    QString::operator=((QString *)(QMakeInternal::statics + 0x108),QVar10);
    QVar11.m_data = "forever";
    QVar11.m_size = 7;
    QString::operator=((QString *)(QMakeInternal::statics + 0x120),QVar11);
    QVar12.m_data = "host_build";
    QVar12.m_size = 10;
    QString::operator=((QString *)(QMakeInternal::statics + 0x138),QVar12);
    ProKey::ProKey((ProKey *)&local_68,"TEMPLATE");
    QString::operator=((QString *)(QMakeInternal::statics + 0x150),(QString *)&local_68);
    QMakeInternal::statics._360_4_ = local_68.m_offset;
    QMakeInternal::statics._364_4_ = local_68.m_length;
    QMakeInternal::statics._368_8_ = local_68._32_8_;
    QMakeInternal::statics._376_8_ = local_68.m_hash;
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_PLATFORM");
    QString::operator=((QString *)(QMakeInternal::statics + 0x180),(QString *)&local_68);
    QMakeInternal::statics._408_4_ = local_68.m_offset;
    QMakeInternal::statics._412_4_ = local_68.m_length;
    QMakeInternal::statics._416_8_ = local_68._32_8_;
    QMakeInternal::statics._424_8_ = local_68.m_hash;
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_DIR_SEP");
    QString::operator=((QString *)(QMakeInternal::statics + 0x1b0),(QString *)&local_68);
    QMakeInternal::statics._456_4_ = local_68.m_offset;
    QMakeInternal::statics._460_4_ = local_68.m_length;
    QMakeInternal::statics._464_8_ = local_68._32_8_;
    QMakeInternal::statics._472_8_ = local_68.m_hash;
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    ProKey::ProKey((ProKey *)&local_68,"QMAKESPEC");
    QString::operator=((QString *)(QMakeInternal::statics + 0x1e0),(QString *)&local_68);
    QMakeInternal::statics._504_4_ = local_68.m_offset;
    QMakeInternal::statics._508_4_ = local_68.m_length;
    QMakeInternal::statics._512_8_ = local_68._32_8_;
    QMakeInternal::statics._520_8_ = local_68.m_hash;
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    ProKey::ProKey((ProKey *)&local_68,"REQUIRES");
    QString::operator=((QString *)(QMakeInternal::statics + 0x210),(QString *)&local_68);
    QMakeInternal::statics._552_4_ = local_68.m_offset;
    QMakeInternal::statics._556_4_ = local_68.m_length;
    QMakeInternal::statics._560_8_ = local_68._32_8_;
    QMakeInternal::statics._568_8_ = local_68.m_hash;
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    ProString::ProString(&local_68,"_FAKE_");
    local_88.size = 0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (ProString *)0x0;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)&local_88,0,&local_68);
    QList<ProString>::end((QList<ProString> *)&local_88);
    qVar3 = local_88.size;
    pPVar2 = local_88.ptr;
    pDVar1 = local_88.d;
    local_b8.super_ProString.m_string.d.size = QMakeInternal::statics._616_8_;
    local_b8.super_ProString.m_string.d.ptr = (char16_t *)QMakeInternal::statics._608_8_;
    local_b8.super_ProString.m_string.d.d = (Data *)QMakeInternal::statics._600_8_;
    local_88.size = 0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (ProString *)0x0;
    QMakeInternal::statics._600_8_ = pDVar1;
    QMakeInternal::statics._608_8_ = pPVar2;
    QMakeInternal::statics._616_8_ = qVar3;
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_b8);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_88);
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    initFunctionStatics();
    QHash<ProKey,_ProKey>::reserve((QHash<ProKey,_ProKey> *)(QMakeInternal::statics + 0x250),0x15);
    lVar4 = 8;
    do {
      str = *(char **)((long)&initStatics::mapInits[0].oldname + lVar4);
      ProKey::ProKey((ProKey *)&local_68,
                     *(char **)((long)&initFunctionStatics::testInits[0x22].args + lVar4));
      ProKey::ProKey(&local_b8,str);
      QHash<ProKey,ProKey>::emplace<ProKey_const&>
                ((QHash<ProKey,ProKey> *)(QMakeInternal::statics + 0x250),(ProKey *)&local_68,
                 &local_b8);
      if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x158);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::initStatics()
{
    if (!statics.field_sep.isNull())
        return;

    statics.field_sep = QLatin1String(" ");
    statics.strtrue = QLatin1String("true");
    statics.strfalse = QLatin1String("false");
    statics.strCONFIG = ProKey("CONFIG");
    statics.strARGS = ProKey("ARGS");
    statics.strARGC = ProKey("ARGC");
    statics.strDot = QLatin1String(".");
    statics.strDotDot = QLatin1String("..");
    statics.strever = QLatin1String("ever");
    statics.strforever = QLatin1String("forever");
    statics.strhost_build = QLatin1String("host_build");
    statics.strTEMPLATE = ProKey("TEMPLATE");
    statics.strQMAKE_PLATFORM = ProKey("QMAKE_PLATFORM");
    statics.strQMAKE_DIR_SEP = ProKey("QMAKE_DIR_SEP");
    statics.strQMAKESPEC = ProKey("QMAKESPEC");
#ifdef PROEVALUATOR_FULL
    statics.strREQUIRES = ProKey("REQUIRES");
#endif

    statics.fakeValue = ProStringList(ProString("_FAKE_")); // It has to have a unique begin() value

    initFunctionStatics();

    static const struct {
        const char * const oldname, * const newname;
    } mapInits[] = {
        { "INTERFACES", "FORMS" },
        { "QMAKE_POST_BUILD", "QMAKE_POST_LINK" },
        { "TARGETDEPS", "POST_TARGETDEPS" },
        { "LIBPATH", "QMAKE_LIBDIR" },
        { "QMAKE_EXT_MOC", "QMAKE_EXT_CPP_MOC" },
        { "QMAKE_MOD_MOC", "QMAKE_H_MOD_MOC" },
        { "QMAKE_LFLAGS_SHAPP", "QMAKE_LFLAGS_APP" },
        { "PRECOMPH", "PRECOMPILED_HEADER" },
        { "PRECOMPCPP", "PRECOMPILED_SOURCE" },
        { "INCPATH", "INCLUDEPATH" },
        { "QMAKE_EXTRA_WIN_COMPILERS", "QMAKE_EXTRA_COMPILERS" },
        { "QMAKE_EXTRA_UNIX_COMPILERS", "QMAKE_EXTRA_COMPILERS" },
        { "QMAKE_EXTRA_WIN_TARGETS", "QMAKE_EXTRA_TARGETS" },
        { "QMAKE_EXTRA_UNIX_TARGETS", "QMAKE_EXTRA_TARGETS" },
        { "QMAKE_EXTRA_UNIX_INCLUDES", "QMAKE_EXTRA_INCLUDES" },
        { "QMAKE_EXTRA_UNIX_VARIABLES", "QMAKE_EXTRA_VARIABLES" },
        { "QMAKE_RPATH", "QMAKE_LFLAGS_RPATH" },
        { "QMAKE_FRAMEWORKDIR", "QMAKE_FRAMEWORKPATH" },
        { "QMAKE_FRAMEWORKDIR_FLAGS", "QMAKE_FRAMEWORKPATH_FLAGS" },
        { "IN_PWD", "PWD" },
        { "DEPLOYMENT", "INSTALLS" }
    };
    statics.varMap.reserve((int)(sizeof(mapInits)/sizeof(mapInits[0])));
    for (unsigned i = 0; i < sizeof(mapInits)/sizeof(mapInits[0]); ++i)
        statics.varMap.insert(ProKey(mapInits[i].oldname), ProKey(mapInits[i].newname));
}